

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

void __thiscall SQLexer::LexLineComment(SQLexer *this)

{
  do {
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
    if (this->_currdata == '\n') {
      return;
    }
  } while (this->_currdata != '\0');
  return;
}

Assistant:

void SQLexer::LexLineComment()
{
    do { NEXT(); } while (CUR_CHAR != _SC('\n') && (!IS_EOB()));
}